

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O2

Literal_t *
Rpo_Recursion(uint *target,Literal_t **vecLit,int nLit,int nLitCount,int nVars,int *thresholdCount,
             int thresholdMax,int verbose)

{
  Rpo_LCI_Edge_t RVar1;
  Literal_t *pLVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  int *vertexDegree;
  Rpo_LCI_Edge_t **edges;
  Rpo_LCI_Edge_t *pRVar9;
  uint *puVar10;
  Vec_Str_t *pVVar11;
  Literal_t *lit;
  Literal_t *pLVar12;
  uint *puVar13;
  Vec_Str_t *pVVar14;
  char *pcVar15;
  ulong uVar16;
  uint uVar17;
  Literal_t *pLVar18;
  Rpo_LCI_Edge_t **ppRVar19;
  uint *puVar20;
  uint uVar21;
  ulong uVar22;
  size_t __size;
  char local_9d;
  ulong local_98;
  
  puVar13 = (uint *)(ulong)(uint)nLit;
  iVar5 = *thresholdCount;
  *thresholdCount = iVar5 + 1;
  if (iVar5 + 1 != thresholdMax) {
    puVar10 = target;
    if (verbose == 0) {
      if (nLitCount != 1) goto LAB_0048fa39;
    }
    else {
      Abc_Print((int)target,"Entering recursion %d\n");
      if (nLitCount != 1) {
LAB_0048fa39:
        vertexDegree = (int *)malloc((long)nLit * 4);
        puVar8 = (uint *)0x0;
        puVar10 = (uint *)0x0;
        if (0 < nLit) {
          puVar10 = puVar13;
        }
        for (; puVar10 != puVar8; puVar8 = (uint *)((long)puVar8 + 1)) {
          vertexDegree[(long)puVar8] = 0;
        }
        pLVar18 = (Literal_t *)((long)(((nLit + -1) * nLit) / 2) << 3);
        edges = (Rpo_LCI_Edge_t **)malloc((size_t)pLVar18);
        if (verbose != 0) {
          Abc_Print((int)pLVar18,"Creating Edges: \n");
        }
        local_98 = 0;
        for (puVar8 = (uint *)0x0; puVar8 != puVar10; puVar8 = (uint *)((long)puVar8 + 1)) {
          puVar20 = puVar8;
          if (vecLit[(long)puVar8] != (Literal_t *)0x0) {
            for (; puVar13 != puVar20; puVar20 = (uint *)((long)puVar20 + 1)) {
              if (vecLit[(long)puVar20] != (Literal_t *)0x0) {
                iVar5 = Rpo_CheckANDGroup(vecLit[(long)puVar8],vecLit[(long)puVar20],nVars);
                pLVar18 = vecLit[(long)puVar8];
                iVar6 = Rpo_CheckORGroup(pLVar18,vecLit[(long)puVar20],nVars);
                if (iVar5 != 0) {
                  if (verbose != 0) {
                    Abc_Print((int)pLVar18,"Grouped: ");
                    pLVar18 = vecLit[(long)puVar20];
                    Lit_PrintExp(pLVar18);
                    Abc_Print((int)pLVar18," AND ");
                    pLVar18 = vecLit[(long)puVar8];
                    Lit_PrintExp(pLVar18);
                    Abc_Print((int)pLVar18,"\n");
                  }
                  pLVar18 = (Literal_t *)0x1;
                  pRVar9 = Rpo_CreateEdge(LIT_AND,(int)puVar8,(int)puVar20,vertexDegree);
                  iVar5 = (int)local_98;
                  local_98 = (ulong)(iVar5 + 1);
                  edges[iVar5] = pRVar9;
                }
                if (iVar6 != 0) {
                  if (verbose != 0) {
                    Abc_Print((int)pLVar18,"Grouped: ");
                    pLVar18 = vecLit[(long)puVar20];
                    Lit_PrintExp(pLVar18);
                    Abc_Print((int)pLVar18," OR ");
                    pLVar18 = vecLit[(long)puVar8];
                    Lit_PrintExp(pLVar18);
                    Abc_Print((int)pLVar18,"\n");
                  }
                  pLVar18 = (Literal_t *)0x2;
                  pRVar9 = Rpo_CreateEdge(LIT_OR,(int)puVar8,(int)puVar20,vertexDegree);
                  iVar5 = (int)local_98;
                  local_98 = (ulong)(iVar5 + 1);
                  edges[iVar5] = pRVar9;
                }
              }
            }
          }
        }
        if (verbose != 0) {
          Abc_Print((int)pLVar18,"%d edges created.\n",local_98);
        }
        iVar5 = 1 << ((char)nVars - 5U & 0x1f);
        if (nVars < 6) {
          iVar5 = 1;
        }
        while( true ) {
          ppRVar19 = edges;
          uVar7 = Rpo_computeMinEdgeCost(edges,(int)local_98,vertexDegree);
          if ((int)uVar7 < 0) break;
          RVar1 = *edges[uVar7];
          uVar21 = (uint)((ulong)RVar1 >> 4) & 0x3fffffff;
          uVar17 = RVar1._4_4_ >> 2;
          uVar22 = (ulong)RVar1 >> 0x22;
          if (uVar21 < uVar17) {
            uVar22 = (ulong)uVar21;
          }
          *edges[uVar7] = (Rpo_LCI_Edge_t)((ulong)RVar1 | 1);
          uVar16 = (ulong)uVar21;
          if (uVar21 <= uVar17) {
            uVar16 = (ulong)RVar1 >> 0x22;
          }
          pLVar12 = vecLit[uVar22];
          pLVar2 = vecLit[uVar16];
          uVar7 = (uint)((ulong)RVar1 >> 1) & 3;
          puVar13 = (uint *)malloc((long)iVar5 << 2);
          puVar10 = (uint *)malloc((long)iVar5 << 2);
          iVar6 = pLVar12->expression->nSize + pLVar2->expression->nSize + 3;
          pVVar11 = Vec_StrAlloc(iVar6);
          if (uVar7 == 2) {
            Kit_TruthOr(puVar13,pLVar12->function,pLVar2->function,nVars);
            local_9d = '+';
          }
          else if (uVar7 == 1) {
            Kit_TruthAnd(puVar13,pLVar12->function,pLVar2->function,nVars);
            local_9d = '*';
          }
          else {
            Abc_Print(iVar6,"Lit_GroupLiterals with op not defined.");
            local_9d = '%';
          }
          Kit_TruthOr(puVar10,pLVar12->transition,pLVar2->transition,nVars);
          Vec_StrPush(pVVar11,'(');
          Vec_StrAppend(pVVar11,pLVar12->expression->pArray);
          Vec_StrPush(pVVar11,local_9d);
          Vec_StrAppend(pVVar11,pLVar2->expression->pArray);
          Vec_StrPush(pVVar11,')');
          Vec_StrPush(pVVar11,'\0');
          iVar6 = 0x18;
          lit = (Literal_t *)malloc(0x18);
          lit->function = puVar13;
          lit->transition = puVar10;
          lit->expression = pVVar11;
          vecLit[uVar22] = lit;
          vecLit[uVar16] = (Literal_t *)0x0;
          if (verbose != 0) {
            Abc_Print(iVar6,"New Literal Cluster found: ");
            pLVar18 = lit;
            Lit_PrintExp(lit);
            Abc_Print((int)pLVar18," -> ");
            puVar13 = lit->function;
            Lit_PrintTT(puVar13,nVars);
            Abc_Print((int)puVar13,"\n");
          }
          pLVar18 = Rpo_Recursion(target,vecLit,nLit,nLitCount + -1,nVars,thresholdCount,
                                  thresholdMax,verbose);
          Lit_Free(lit);
          vecLit[uVar22] = pLVar12;
          vecLit[uVar16] = pLVar2;
          if ((*thresholdCount == thresholdMax) || (pLVar18 != (Literal_t *)0x0)) goto LAB_0048ffa7;
        }
        if (verbose == 0) {
          pLVar18 = (Literal_t *)0x0;
        }
        else {
          pLVar18 = (Literal_t *)0x0;
          Abc_Print((int)ppRVar19,"There is no edges unvisited... Exiting recursion.\n");
        }
LAB_0048ffa7:
        free(vertexDegree);
        uVar22 = 0;
        if ((int)local_98 < 1) {
          local_98 = uVar22;
        }
        for (; local_98 != uVar22; uVar22 = uVar22 + 1) {
          if (edges[uVar22] != (Rpo_LCI_Edge_t *)0x0) {
            free(edges[uVar22]);
            edges[uVar22] = (Rpo_LCI_Edge_t *)0x0;
          }
        }
        free(edges);
        return pLVar18;
      }
      Abc_Print((int)puVar10,"Checking solution: ");
    }
    uVar22 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
    if (nVars < 6) {
      uVar22 = 1;
    }
    puVar8 = (uint *)0x0;
    if (nLit < 1) {
      puVar13 = puVar8;
    }
    for (; iVar5 = (int)puVar10, puVar8 != puVar13; puVar8 = (uint *)((long)puVar8 + 1)) {
      pLVar18 = vecLit[(long)puVar8];
      if (pLVar18 != (Literal_t *)0x0) {
        puVar10 = pLVar18->function;
        uVar16 = uVar22;
        do {
          if ((int)uVar16 < 1) {
            pLVar12 = (Literal_t *)malloc(0x18);
            __size = (long)(int)uVar22 << 2;
            puVar13 = (uint *)malloc(__size);
            pLVar12->function = puVar13;
            Kit_TruthCopy(puVar13,puVar10,nVars);
            puVar13 = (uint *)malloc(__size);
            pLVar12->transition = puVar13;
            Kit_TruthCopy(puVar13,pLVar18->transition,nVars);
            pVVar11 = pLVar18->expression;
            pVVar14 = (Vec_Str_t *)malloc(0x10);
            iVar5 = pVVar11->nSize;
            pVVar14->nSize = iVar5;
            iVar6 = pVVar11->nCap;
            pVVar14->nCap = iVar6;
            if ((long)iVar6 == 0) {
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar15 = (char *)malloc((long)iVar6);
            }
            pVVar14->pArray = pcVar15;
            memcpy(pcVar15,pVVar11->pArray,(long)iVar5);
            iVar5 = (int)pcVar15;
            pLVar12->expression = pVVar14;
            if (verbose == 0) {
              return pLVar12;
            }
            pcVar15 = "FOUND!\n";
            goto LAB_0048ff8f;
          }
          lVar3 = uVar16 - 1;
          lVar4 = uVar16 - 1;
          uVar16 = uVar16 - 1;
        } while (target[lVar3] == puVar10[lVar4]);
      }
      puVar10 = puVar13;
    }
    if (verbose != 0) {
      pcVar15 = "FAILED!\n";
      pLVar12 = (Literal_t *)0x0;
LAB_0048ff8f:
      Abc_Print(iVar5,pcVar15,thresholdCount);
      return pLVar12;
    }
  }
  return (Literal_t *)0x0;
}

Assistant:

Literal_t* Rpo_Recursion(unsigned* target, Literal_t** vecLit, int nLit, int nLitCount, int nVars, int* thresholdCount, int thresholdMax, int verbose) {
    int i, j, k;
    Literal_t* copyResult;
    int* vertexDegree;
    int v;
    int edgeSize;
    Rpo_LCI_Edge_t** edges;
    int edgeCount = 0;
    int isAnd;
    int isOr;
    Rpo_LCI_Edge_t* edge;
    Literal_t* result = NULL;
    int edgeIndex;
    int minLitIndex;
    int maxLitIndex;
    Literal_t* oldLit1;
    Literal_t* oldLit2;
    Literal_t* newLit;

    *thresholdCount = *thresholdCount + 1;
    if (*thresholdCount == thresholdMax) {
        return NULL;
    }
    if (verbose) {
        Abc_Print(-2, "Entering recursion %d\n", *thresholdCount);
    }
    // verify if solution is the target or not
    if (nLitCount == 1) {
        if (verbose) {
            Abc_Print(-2, "Checking solution: ");
        }
        for (k = 0; k < nLit; ++k) {
            if (vecLit[k] != NULL) {
                if (Kit_TruthIsEqual(target, vecLit[k]->function, nVars)) {
                    copyResult = Lit_Copy(vecLit[k], nVars);
                    if (verbose) {
                        Abc_Print(-2, "FOUND!\n", thresholdCount);
                    }
                    thresholdCount = 0; //??
                    return copyResult;
                }
            }
        }
        if (verbose) {
            Abc_Print(-2, "FAILED!\n", thresholdCount);
        }
        return NULL;
    }

    vertexDegree = ABC_ALLOC(int, nLit);
    //    if(verbose) {
    //        Abc_Print(-2,"Allocating vertexDegree...\n");
    //    }
    for (v = 0; v < nLit; v++) {
        vertexDegree[v] = 0;
    }
    // building edges
    edgeSize = (nLit * (nLit - 1)) / 2;
    edges = ABC_ALLOC(Rpo_LCI_Edge_t*, edgeSize);
    if (verbose) {
        Abc_Print(-2, "Creating Edges: \n");
    }

    for (i = 0; i < nLit; ++i) {
        if (vecLit[i] == NULL) {
            continue;
        }
        for (j = i; j < nLit; ++j) {
            if (vecLit[j] == NULL) {
                continue;
            }
            isAnd = Rpo_CheckANDGroup(vecLit[i], vecLit[j], nVars);
            isOr = Rpo_CheckORGroup(vecLit[i], vecLit[j], nVars);
            if (isAnd) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " AND ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_AND, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
            if (isOr) {
                if (verbose) {
                    Abc_Print(-2, "Grouped: ");
                    Lit_PrintExp(vecLit[j]);
                    Abc_Print(-2, " OR ");
                    Lit_PrintExp(vecLit[i]);
                    Abc_Print(-2, "\n");
                }
                // add edge
                edge = Rpo_CreateEdge(LIT_OR, i, j, vertexDegree);
                edges[edgeCount++] = edge;
            }
        }
    }
    if (verbose) {
        Abc_Print(-2, "%d edges created.\n", edgeCount);
    }


    //traverse the edges, grouping new Literal Clusters
    do {
        edgeIndex = Rpo_computeMinEdgeCost(edges, edgeCount, vertexDegree);
        if (edgeIndex < 0) {
            if (verbose) {
                Abc_Print(-2, "There is no edges unvisited... Exiting recursion.\n");
                //exit(-1);
            }
            break;
            //return NULL; // the graph does not have unvisited edges
        }
        edge = edges[edgeIndex];
        edge->visited = 1;
        //Rpo_PrintEdge(edge);
        minLitIndex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
        maxLitIndex = (edge->idx1 > edge->idx2) ? edge->idx1 : edge->idx2;
        oldLit1 = vecLit[minLitIndex];
        oldLit2 = vecLit[maxLitIndex];
        newLit = Lit_GroupLiterals(oldLit1, oldLit2, (Operator_t)edge->connectionType, nVars);
        vecLit[minLitIndex] = newLit;
        vecLit[maxLitIndex] = NULL;

        if (verbose) {
            Abc_Print(-2, "New Literal Cluster found: ");
            Lit_PrintExp(newLit);
            Abc_Print(-2, " -> ");
            Lit_PrintTT(newLit->function, nVars);
            Abc_Print(-2, "\n");
        }
        result = Rpo_Recursion(target, vecLit, nLit, (nLitCount - 1), nVars, thresholdCount, thresholdMax, verbose);
        //independent of result, free the newLit and restore the vector of Literal Clusters
        Lit_Free(newLit);
        vecLit[minLitIndex] = oldLit1;
        vecLit[maxLitIndex] = oldLit2;
        if (*thresholdCount == thresholdMax) {
            break;
        }
    } while (result == NULL);
    //freeing memory
    //    if(verbose) {
    //        Abc_Print(-2,"Freeing vertexDegree...\n");
    //    }
    ABC_FREE(vertexDegree);
    for (i = 0; i < edgeCount; ++i) {
        //Abc_Print(-2, "%p ", edges[i]);
        ABC_FREE(edges[i]);
    }
    ABC_FREE(edges);
    return result;
}